

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

lyxp_set * set_copy(lyxp_set *set)

{
  lyxp_set_type lVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  lyxp_set_type lVar8;
  undefined4 uVar9;
  lyxp_set *__ptr;
  lyxp_set_nodes *plVar10;
  char *pcVar11;
  LY_ERR *pLVar12;
  
  __ptr = (lyxp_set *)malloc(0x30);
  if (__ptr == (lyxp_set *)0x0) {
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EMEM;
    __ptr = (lyxp_set *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_copy");
  }
  else {
    lVar1 = set->type;
    if (lVar1 - LYXP_SET_NODE_SET < 2) {
      __ptr->type = lVar1;
      uVar2 = set->used;
      plVar10 = (lyxp_set_nodes *)malloc((ulong)uVar2 << 4);
      (__ptr->val).nodes = plVar10;
      if (plVar10 == (lyxp_set_nodes *)0x0) {
        pLVar12 = ly_errno_location();
        *pLVar12 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_copy");
        free(__ptr);
        __ptr = (lyxp_set *)0x0;
      }
      else {
        memcpy(plVar10,(set->val).nodes,(ulong)uVar2 << 4);
        __ptr->size = uVar2;
        __ptr->used = uVar2;
        __ptr->ctx_pos = set->ctx_pos;
        __ptr->ctx_size = set->ctx_size;
      }
    }
    else {
      lVar8 = set->type;
      uVar9 = *(undefined4 *)&set->field_0x4;
      uVar3 = *(undefined8 *)&set->field_0x8;
      plVar10 = (set->val).nodes;
      uVar4 = *(undefined8 *)((long)&set->val + 8);
      uVar5 = set->size;
      uVar6 = set->ctx_pos;
      uVar7 = set->ctx_size;
      __ptr->used = set->used;
      __ptr->size = uVar5;
      __ptr->ctx_pos = uVar6;
      __ptr->ctx_size = uVar7;
      (__ptr->val).nodes = plVar10;
      *(undefined8 *)((long)&__ptr->val + 8) = uVar4;
      __ptr->type = lVar8;
      *(undefined4 *)&__ptr->field_0x4 = uVar9;
      *(undefined8 *)&__ptr->field_0x8 = uVar3;
      if (lVar1 == LYXP_SET_STRING) {
        pcVar11 = strdup((set->val).str);
        (__ptr->val).str = pcVar11;
      }
    }
  }
  return __ptr;
}

Assistant:

static struct lyxp_set *
set_copy(struct lyxp_set *set)
{
    struct lyxp_set *ret;

    if (!set) {
        return NULL;
    }

    ret = malloc(sizeof *ret);
    if (!ret) {
        LOGMEM;
        return NULL;
    }
    if ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_SNODE_SET)) {
        ret->type = set->type;
        ret->val.nodes = malloc(set->used * sizeof *ret->val.nodes);
        if (!ret->val.nodes) {
            LOGMEM;
            free(ret);
            return NULL;
        }
        memcpy(ret->val.nodes, set->val.nodes, set->used * sizeof *ret->val.nodes);

        ret->used = ret->size = set->used;
        ret->ctx_pos = set->ctx_pos;
        ret->ctx_size = set->ctx_size;
    } else {
       memcpy(ret, set, sizeof *ret);
       if (set->type == LYXP_SET_STRING) {
           ret->val.str = strdup(set->val.str);
       }
    }

    return ret;
}